

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjectType.h
# Opt level: O2

void __thiscall
KDIS::PDU::Areal_Object_State_PDU::SetObjectType(Areal_Object_State_PDU *this,ObjectType *O)

{
  KUINT8 KVar1;
  KUINT8 KVar2;
  KUINT8 KVar3;
  
  KVar1 = O->m_ui8EntityKind;
  KVar2 = O->m_ui8Category;
  KVar3 = O->m_ui8SubCategory;
  (this->m_ObjTyp).m_ui8Domain = O->m_ui8Domain;
  (this->m_ObjTyp).m_ui8EntityKind = KVar1;
  (this->m_ObjTyp).m_ui8Category = KVar2;
  (this->m_ObjTyp).m_ui8SubCategory = KVar3;
  return;
}

Assistant:

class KDIS_EXPORT ObjectType : public DataTypeBase
{
protected:

    KUINT8 m_ui8Domain;

    KUINT8 m_ui8EntityKind;

    KUINT8 m_ui8Category;

    KUINT8 m_ui8SubCategory;

public:

    static const KUINT16 OBJECT_TYPE_SIZE = 4;

    ObjectType();

    ObjectType( KUINT8 Domain, KUINT8 Kind, KUINT8  Categoy, KUINT8 SubCategory );

    ObjectType(KDataStream &stream) noexcept(false);

    virtual ~ObjectType();

    //************************************
    // FullName:    KDIS::DATA_TYPE::ObjectType::SetDomain
    //              KDIS::DATA_TYPE::ObjectType::GetDomain
    // Description: Objects domain.
    // Parameter:   EntityDomain  UI
    //************************************
    void SetDomain( KDIS::DATA_TYPE::ENUMS::EntityDomain UI );
    KDIS::DATA_TYPE::ENUMS::EntityDomain GetDomain() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::ObjectType::SetEntityKind
    //              KDIS::DATA_TYPE::ObjectType::GetEntityKind
    // Description: Object Kind.
    // Parameter:   KUINT8 UI
    //************************************
    void SetEntityKind( KUINT8 UI );
    KUINT8 GetEntityKind() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::ObjectType::SetCategory
    //              KDIS::DATA_TYPE::ObjectType::GetCategory
    // Description: Category.
    // Parameter:   KUINT8 UI
    //************************************
    void SetCategory( KUINT8 UI );
    KUINT8 GetCategory() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::ObjectType::SetSubCategory
    //              KDIS::DATA_TYPE::ObjectType::GetSubCategory
    // Description: Sub Category.
    // Parameter:   KUINT8 UI
    //************************************
    void SetSubCategory( KUINT8 UI );
    KUINT8 GetSubCategory() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::ObjectType::GetAsString
    // Description: Returns a string representation.
    //************************************
    virtual KString GetAsString() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::ObjectType::Decode
    // Description: Convert From Network Data.
    // Parameter:   KDataStream & stream
    //************************************
    virtual void Decode(KDataStream &stream) noexcept(false);

    //************************************
    // FullName:    KDIS::DATA_TYPE::ObjectType::Encode
    // Description: Convert To Network Data.
    // Parameter:   KDataStream & stream
    //************************************
    virtual KDataStream Encode() const;
    virtual void Encode( KDataStream & stream ) const;

    KBOOL operator == ( const ObjectType & Value ) const;
    KBOOL operator != ( const ObjectType & Value ) const;
    KBOOL operator  < ( const ObjectType & Value ) const;
}